

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4.h
# Opt level: O1

void ncnn::im2col_sgemm_pack1to4_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  int iVar6;
  uint _h;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int *piVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  int iVar18;
  _func_int ***ppp_Var19;
  undefined4 *puVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  undefined4 *puVar25;
  float *pfVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  uint uVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  int iVar32;
  undefined4 *puVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float zeros [4];
  Mat local_a8;
  ulong local_58;
  void *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar5 = bottom_im2col->w;
  uVar23 = (ulong)(int)uVar5;
  iVar6 = bottom_im2col->h;
  _h = bottom_im2col->c;
  uVar22 = (ulong)_h;
  local_58 = (ulong)(uint)top_blob->c;
  local_50 = _bias->data;
  local_a8.cstep = 0;
  local_a8.data = (Allocator *)0x0;
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize._0_4_ = 0;
  local_a8.elempack = 0;
  local_a8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  if ((long)uVar23 < 8) {
    iVar18 = iVar6;
    uVar17 = uVar5;
    if (3 < (int)uVar5) {
      iVar18 = iVar6 * 4;
      uVar17 = (uVar5 & 3) + 1;
    }
  }
  else {
    iVar18 = iVar6 * 8;
    uVar17 = (uVar5 & 3) + (uVar5 >> 3) + (uint)((uVar5 >> 2 & 1) != 0);
  }
  local_a8.elemsize._4_4_ = (int)local_a8.refcount;
  local_a8.allocator = (Allocator *)local_a8.data;
  local_a8.dims = (int)local_a8.refcount;
  local_a8.w = local_a8.refcount._4_4_;
  local_a8.c = local_a8.elempack;
  Mat::create(&local_a8,iVar18,_h,uVar17,4,1,opt->workspace_allocator);
  uVar17 = (int)uVar5 >> 3;
  if (0 < (int)uVar17) {
    lVar24 = 0x10;
    uVar27 = 0;
    do {
      if (0 < (int)_h) {
        ppp_Var19 = (_func_int ***)
                    ((long)(_func_int ***)local_a8.data +
                    local_a8.cstep * uVar27 *
                    CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize));
        uVar30 = 0;
        do {
          if (0 < iVar6) {
            sVar7 = bottom_im2col->cstep;
            sVar8 = bottom_im2col->elemsize;
            lVar34 = (long)bottom_im2col->data + lVar24;
            iVar18 = iVar6;
            do {
              *(undefined1 (*) [32])ppp_Var19 =
                   *(undefined1 (*) [32])(lVar34 + -0x10 + sVar7 * sVar8 * uVar30);
              ppp_Var19 = ppp_Var19 + 4;
              lVar34 = lVar34 + uVar23 * 4;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar22);
      }
      uVar27 = uVar27 + 1;
      lVar24 = lVar24 + 0x20;
    } while (uVar27 != uVar17);
  }
  uVar21 = uVar5 >> 2 & 1;
  if ((uVar21 != 0) && (0 < (int)_h)) {
    ppp_Var19 = (_func_int ***)
                ((long)(_func_int ***)local_a8.data +
                (long)(int)uVar17 * local_a8.cstep *
                CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize));
    uVar27 = 0;
    do {
      if (0 < iVar6) {
        pauVar31 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar27 +
                   (uVar23 & 0xfffffffffffffff8) * 4);
        iVar18 = iVar6;
        do {
          *(undefined1 (*) [16])ppp_Var19 = *pauVar31;
          ppp_Var19 = ppp_Var19 + 2;
          pauVar31 = (undefined1 (*) [16])(*pauVar31 + uVar23 * 4);
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != uVar22);
  }
  iVar18 = (int)(uVar23 & 0xfffffffffffffff8) + uVar21 * 4;
  if (iVar18 < (int)uVar5) {
    lVar24 = (long)iVar18;
    puVar20 = (undefined4 *)(lVar24 * 4 + (long)bottom_im2col->data);
    sVar7 = bottom_im2col->cstep;
    sVar8 = bottom_im2col->elemsize;
    do {
      if (0 < (int)_h) {
        uVar17 = (uint)lVar24;
        uVar29 = uVar17 + 7;
        uVar21 = uVar17 + 3;
        if (-1 < (int)uVar17) {
          uVar29 = uVar17;
          uVar21 = uVar17;
        }
        iVar32 = uVar17 - (uVar29 & 0xfffffff8);
        iVar18 = (uVar17 - (uVar29 & 0xfffffff8)) + 3;
        if (-1 < iVar32) {
          iVar18 = iVar32;
        }
        ppp_Var19 = (_func_int ***)
                    ((long)(_func_int ***)local_a8.data +
                    (long)(int)((iVar18 >> 2) +
                               ((int)uVar29 >> 3) + (uVar17 - (uVar21 & 0xfffffffc))) *
                    local_a8.cstep * CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize)
                    );
        uVar27 = 0;
        puVar25 = puVar20;
        do {
          puVar33 = puVar25;
          iVar18 = iVar6;
          if (0 < iVar6) {
            do {
              *(undefined4 *)ppp_Var19 = *puVar33;
              ppp_Var19 = (_func_int ***)((long)ppp_Var19 + 4);
              puVar33 = puVar33 + uVar23;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          uVar27 = uVar27 + 1;
          puVar25 = (undefined4 *)((long)puVar25 + sVar7 * sVar8);
        } while (uVar27 != uVar22);
      }
      lVar24 = lVar24 + 1;
      puVar20 = puVar20 + 1;
    } while (lVar24 < (long)uVar23);
  }
  if (0 < (int)local_58) {
    iVar18 = _h * iVar6;
    uVar22 = 0;
    do {
      pauVar28 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar22 * top_blob->elemsize + (long)top_blob->data);
      pauVar31 = (undefined1 (*) [16])(uVar22 * 0x10 + (long)local_50);
      if (local_50 == (void *)0x0) {
        pauVar31 = (undefined1 (*) [16])&local_48;
      }
      local_48 = 0;
      uStack_40 = 0;
      if ((int)uVar5 < 8) {
        uVar27 = 0;
      }
      else {
        lVar24 = 0;
        uVar30 = 0;
        do {
          auVar49 = *pauVar31;
          auVar48 = auVar49;
          auVar47 = auVar49;
          auVar46 = auVar49;
          auVar44 = auVar49;
          auVar42 = auVar49;
          auVar40 = auVar49;
          auVar37 = auVar49;
          if (0 < iVar18) {
            lVar34 = local_a8.cstep *
                     CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) * lVar24;
            lVar36 = 0;
            iVar32 = iVar18;
            auVar45 = auVar49;
            auVar43 = auVar49;
            auVar41 = auVar49;
            auVar38 = auVar49;
            auVar39 = auVar49;
            auVar14 = auVar49;
            auVar15 = auVar49;
            auVar16 = auVar49;
            do {
              pfVar26 = (float *)((long)kernel->data +
                                 lVar36 + kernel->cstep * uVar22 * kernel->elemsize);
              fVar2 = *pfVar26;
              fVar3 = pfVar26[1];
              fVar4 = pfVar26[2];
              fVar9 = pfVar26[3];
              fVar1 = *(float *)((long)(_func_int ***)local_a8.data + lVar36 * 2 + lVar34);
              auVar49._0_4_ = fVar1 * fVar2 + auVar16._0_4_;
              auVar49._4_4_ = fVar1 * fVar3 + auVar16._4_4_;
              auVar49._8_4_ = fVar1 * fVar4 + auVar16._8_4_;
              auVar49._12_4_ = fVar1 * fVar9 + auVar16._12_4_;
              fVar1 = *(float *)((long)(_func_int ***)local_a8.data + lVar36 * 2 + lVar34 + 4);
              auVar48._0_4_ = fVar1 * fVar2 + auVar15._0_4_;
              auVar48._4_4_ = fVar1 * fVar3 + auVar15._4_4_;
              auVar48._8_4_ = fVar1 * fVar4 + auVar15._8_4_;
              auVar48._12_4_ = fVar1 * fVar9 + auVar15._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator +
                                lVar36 * 2 + lVar34);
              auVar47._0_4_ = fVar1 * fVar2 + auVar14._0_4_;
              auVar47._4_4_ = fVar1 * fVar3 + auVar14._4_4_;
              auVar47._8_4_ = fVar1 * fVar4 + auVar14._8_4_;
              auVar47._12_4_ = fVar1 * fVar9 + auVar14._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator +
                                lVar36 * 2 + lVar34 + 4);
              auVar46._0_4_ = fVar1 * fVar2 + auVar39._0_4_;
              auVar46._4_4_ = fVar1 * fVar3 + auVar39._4_4_;
              auVar46._8_4_ = fVar1 * fVar4 + auVar39._8_4_;
              auVar46._12_4_ = fVar1 * fVar9 + auVar39._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_a8.data + 0x10))->_vptr_Allocator
                                + lVar36 * 2 + lVar34);
              auVar44._0_4_ = fVar1 * fVar2 + auVar38._0_4_;
              auVar44._4_4_ = fVar1 * fVar3 + auVar38._4_4_;
              auVar44._8_4_ = fVar1 * fVar4 + auVar38._8_4_;
              auVar44._12_4_ = fVar1 * fVar9 + auVar38._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_a8.data + 0x10))->_vptr_Allocator
                                + lVar36 * 2 + lVar34 + 4);
              auVar42._0_4_ = fVar1 * fVar2 + auVar41._0_4_;
              auVar42._4_4_ = fVar1 * fVar3 + auVar41._4_4_;
              auVar42._8_4_ = fVar1 * fVar4 + auVar41._8_4_;
              auVar42._12_4_ = fVar1 * fVar9 + auVar41._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_a8.data + 0x18))->_vptr_Allocator
                                + lVar36 * 2 + lVar34);
              auVar40._0_4_ = fVar1 * fVar2 + auVar43._0_4_;
              auVar40._4_4_ = fVar1 * fVar3 + auVar43._4_4_;
              auVar40._8_4_ = fVar1 * fVar4 + auVar43._8_4_;
              auVar40._12_4_ = fVar1 * fVar9 + auVar43._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_a8.data + 0x18))->_vptr_Allocator
                                + lVar36 * 2 + lVar34 + 4);
              auVar37._0_4_ = fVar1 * fVar2 + auVar45._0_4_;
              auVar37._4_4_ = fVar1 * fVar3 + auVar45._4_4_;
              auVar37._8_4_ = fVar1 * fVar4 + auVar45._8_4_;
              auVar37._12_4_ = fVar1 * fVar9 + auVar45._12_4_;
              lVar36 = lVar36 + 0x10;
              iVar32 = iVar32 + -1;
              auVar45 = auVar37;
              auVar43 = auVar40;
              auVar41 = auVar42;
              auVar38 = auVar44;
              auVar39 = auVar46;
              auVar14 = auVar47;
              auVar15 = auVar48;
              auVar16 = auVar49;
            } while (iVar32 != 0);
          }
          *pauVar28 = auVar49;
          pauVar28[1] = auVar48;
          pauVar28[2] = auVar47;
          pauVar28[3] = auVar46;
          pauVar28[4] = auVar44;
          pauVar28[5] = auVar42;
          pauVar28[6] = auVar40;
          pauVar28[7] = auVar37;
          pauVar28 = pauVar28 + 8;
          uVar27 = uVar30 + 8;
          lVar34 = uVar30 + 0xf;
          lVar24 = lVar24 + 1;
          uVar30 = uVar27;
        } while (lVar34 < (long)uVar23);
      }
      if ((int)((uint)uVar27 | 3) < (int)uVar5) {
        uVar17 = 0;
        do {
          auVar45 = *pauVar31;
          iVar32 = (int)uVar27;
          auVar43 = auVar45;
          auVar41 = auVar45;
          auVar38 = auVar45;
          if (0 < (int)(_h * iVar6)) {
            lVar24 = local_a8.cstep *
                     CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) *
                     (ulong)((uVar17 & 1) + ((uint)(uVar27 >> 3) & 0x1fffffff));
            lVar34 = 0;
            iVar35 = iVar18;
            auVar49 = auVar45;
            auVar48 = auVar45;
            auVar47 = auVar45;
            auVar46 = auVar45;
            do {
              pfVar26 = (float *)((long)kernel->data +
                                 lVar34 + kernel->cstep * uVar22 * kernel->elemsize);
              fVar9 = *pfVar26;
              fVar10 = pfVar26[1];
              fVar11 = pfVar26[2];
              fVar12 = pfVar26[3];
              fVar1 = *(float *)((long)(_func_int ***)local_a8.data + lVar34 + lVar24);
              fVar2 = *(float *)((long)(_func_int ***)local_a8.data + lVar34 + lVar24 + 4);
              fVar3 = *(float *)((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator +
                                lVar34 + lVar24);
              fVar4 = *(float *)((long)&((Allocator *)((long)local_a8.data + 8))->_vptr_Allocator +
                                lVar34 + lVar24 + 4);
              auVar45._0_4_ = fVar1 * fVar9 + auVar46._0_4_;
              auVar45._4_4_ = fVar1 * fVar10 + auVar46._4_4_;
              auVar45._8_4_ = fVar1 * fVar11 + auVar46._8_4_;
              auVar45._12_4_ = fVar1 * fVar12 + auVar46._12_4_;
              auVar43._0_4_ = fVar2 * fVar9 + auVar47._0_4_;
              auVar43._4_4_ = fVar2 * fVar10 + auVar47._4_4_;
              auVar43._8_4_ = fVar2 * fVar11 + auVar47._8_4_;
              auVar43._12_4_ = fVar2 * fVar12 + auVar47._12_4_;
              auVar41._0_4_ = fVar3 * fVar9 + auVar48._0_4_;
              auVar41._4_4_ = fVar3 * fVar10 + auVar48._4_4_;
              auVar41._8_4_ = fVar3 * fVar11 + auVar48._8_4_;
              auVar41._12_4_ = fVar3 * fVar12 + auVar48._12_4_;
              auVar38._0_4_ = fVar4 * fVar9 + auVar49._0_4_;
              auVar38._4_4_ = fVar4 * fVar10 + auVar49._4_4_;
              auVar38._8_4_ = fVar4 * fVar11 + auVar49._8_4_;
              auVar38._12_4_ = fVar4 * fVar12 + auVar49._12_4_;
              lVar34 = lVar34 + 0x10;
              iVar35 = iVar35 + -1;
              auVar49 = auVar38;
              auVar48 = auVar41;
              auVar47 = auVar43;
              auVar46 = auVar45;
            } while (iVar35 != 0);
          }
          *pauVar28 = auVar45;
          pauVar28[1] = auVar43;
          pauVar28[2] = auVar41;
          pauVar28[3] = auVar38;
          pauVar28 = pauVar28 + 4;
          uVar21 = iVar32 + 4;
          uVar30 = (ulong)uVar21;
          uVar17 = (uint)(byte)((char)uVar17 + 1);
          uVar27 = (ulong)uVar21;
        } while (iVar32 + 7 < (int)uVar5);
      }
      else {
        uVar30 = uVar27 & 0xffffffff;
      }
      if ((int)uVar30 < (int)uVar5) {
        do {
          uVar17 = (uint)uVar30;
          auVar39 = *pauVar31;
          if (0 < (int)(_h * iVar6)) {
            pfVar26 = (float *)(kernel->cstep * uVar22 * kernel->elemsize + (long)kernel->data);
            lVar24 = 0;
            auVar49 = auVar39;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_a8.data +
                                lVar24 * 4 +
                                local_a8.cstep *
                                CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize) *
                                (ulong)((uVar17 & 3) + (int)(uVar30 >> 3) +
                                       (uint)((uVar17 >> 2 & 1) != 0)));
              auVar39._0_4_ = fVar1 * *pfVar26 + auVar49._0_4_;
              auVar39._4_4_ = fVar1 * pfVar26[1] + auVar49._4_4_;
              auVar39._8_4_ = fVar1 * pfVar26[2] + auVar49._8_4_;
              auVar39._12_4_ = fVar1 * pfVar26[3] + auVar49._12_4_;
              pfVar26 = pfVar26 + 4;
              lVar24 = lVar24 + 1;
              auVar49 = auVar39;
            } while (iVar18 != (int)lVar24);
          }
          *pauVar28 = auVar39;
          pauVar28 = pauVar28 + 1;
          uVar30 = (ulong)(uVar17 + 1);
        } while (uVar17 + 1 != uVar5);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != local_58);
  }
  piVar13 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_a8.data != (Allocator *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    __m128 _r1 = _mm_loadu_ps(img0 + 4);
                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            _mm_store_ps(outptr0 + 16, _sum4);
            _mm_store_ps(outptr0 + 20, _sum5);
            _mm_store_ps(outptr0 + 24, _sum6);
            _mm_store_ps(outptr0 + 28, _sum7);
            outptr0 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            outptr0 += 16;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _val = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum);
            outptr0 += 4;
        }
    }
}